

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iwmmxt_helper.c
# Opt level: O1

uint64_t helper_iwmmxt_sraw_aarch64(CPUARMState_conflict *env,uint64_t x,uint32_t n)

{
  byte bVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  
  bVar1 = (byte)n;
  uVar6 = (uint)(int)(short)x >> (bVar1 & 0x1f);
  uVar2 = (uint)((int)x >> 0x10) >> (bVar1 & 0x1f);
  uVar5 = (uint)((int)(x >> 0x10) >> 0x10) >> (bVar1 & 0x1f) & 0xffff;
  uVar3 = (uint)((long)x >> 0x30) >> (bVar1 & 0x1f);
  uVar4 = uVar3 & 0xffff;
  (env->iwmmxt).cregs[3] =
       uVar2 & 0x8000 | uVar6 >> 8 & 0x80 | (uint)((uVar2 & 0xffff) == 0) << 0xe |
       (uint)(0x7fff < uVar5) << 0x17 | (uint)(uVar5 == 0) << 0x16 | (uint)(0x7fff < uVar4) << 0x1f
       | (uint)(uVar4 == 0) << 0x1e | (uint)((short)uVar6 == 0) << 6;
  return (ulong)uVar5 << 0x20 | (ulong)uVar3 << 0x30 | (ulong)(uVar6 & 0xffff | uVar2 << 0x10);
}

Assistant:

uint64_t HELPER(iwmmxt_sraw)(CPUARMState *env, uint64_t x, uint32_t n)
{
    x = ((uint64_t) ((EXTEND16(x >> 0) >> n) & 0xffff) << 0) |
        ((uint64_t) ((EXTEND16(x >> 16) >> n) & 0xffff) << 16) |
        ((uint64_t) ((EXTEND16(x >> 32) >> n) & 0xffff) << 32) |
        ((uint64_t) ((EXTEND16(x >> 48) >> n) & 0xffff) << 48);
    env->iwmmxt.cregs[ARM_IWMMXT_wCASF] =
        NZBIT16(x >> 0, 0) | NZBIT16(x >> 16, 1) |
        NZBIT16(x >> 32, 2) | NZBIT16(x >> 48, 3);
    return x;
}